

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
CreateArrayIndex(ExpressionContext *ctx,SynBase *source,ExprBase *value,
                ArrayView<ArgumentData> arguments)

{
  Allocator *pAVar1;
  undefined8 uVar2;
  SynIdentifier *pSVar3;
  FunctionData *pFVar4;
  int iVar5;
  int iVar6;
  ExprBase *pEVar7;
  undefined4 extraout_var;
  TypeHandle *pTVar8;
  ExprGetAddress *pEVar9;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  SynBase *pSVar10;
  VariableData *pVVar11;
  undefined4 extraout_var_05;
  _func_int **pp_Var12;
  ExprGetAddress *pEVar13;
  ExprBase *pEVar14;
  undefined4 extraout_var_07;
  TypeRef *pTVar15;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  TypeBase *pTVar16;
  undefined8 *puVar17;
  TypeError *pTVar18;
  _func_int *p_Var19;
  ArgumentData *pAVar20;
  uint uVar21;
  long lVar22;
  char *msg;
  _func_int *p_Var23;
  uint count_1;
  ulong uVar24;
  bool bVar25;
  TypeUnsizedArray *type;
  TypeBase *pTVar26;
  bool bVar27;
  InplaceStr name;
  InplaceStr name_00;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<ArgumentData> arguments_01;
  TypePair typePair;
  SmallArray<ArgumentData,_4U> local_108;
  VariableHandle *variable;
  undefined4 extraout_var_00;
  undefined4 extraout_var_06;
  undefined4 extraout_var_12;
  
  pAVar20 = arguments.data;
  uVar21 = arguments.count;
  if ((((value != (ExprBase *)0x0) && (value->typeID == 8)) &&
      (pp_Var12 = value[1]._vptr_ExprBase, pp_Var12 != (_func_int **)0x0)) &&
     (uVar21 == 1 && *(int *)(pp_Var12 + 1) == 0x1b)) {
    pEVar7 = anon_unknown.dwarf_9c70f::EvaluateExpression(ctx,source,pAVar20->value);
    if ((pEVar7 == (ExprBase *)0x0) || (pEVar7->typeID != 6)) {
      msg = "ERROR: expression didn\'t evaluate to a constant number";
    }
    else if ((long)pEVar7[1]._vptr_ExprBase < 0) {
      msg = "ERROR: argument index can\'t be negative";
    }
    else {
      p_Var19 = pp_Var12[0xc];
      if (p_Var19 != (_func_int *)0x0) {
        uVar21 = 0;
        p_Var23 = p_Var19;
        do {
          uVar21 = uVar21 + 1;
          p_Var23 = *(_func_int **)(p_Var23 + 8);
        } while (p_Var23 != (_func_int *)0x0);
        if ((long)pEVar7[1]._vptr_ExprBase < (long)(ulong)uVar21) {
          iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
          pEVar14 = (ExprBase *)CONCAT44(extraout_var,iVar5);
          pTVar16 = ctx->typeTypeID;
          pTVar8 = IntrusiveList<TypeHandle>::operator[]
                             ((IntrusiveList<TypeHandle> *)(pp_Var12 + 0xc),
                              *(uint *)&pEVar7[1]._vptr_ExprBase);
          pTVar26 = pTVar8->type;
          pEVar14->typeID = 8;
          pEVar14->source = source;
          pEVar14->type = pTVar16;
          pEVar14->next = (ExprBase *)0x0;
          pEVar14->listed = false;
          pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223580;
          pEVar14[1]._vptr_ExprBase = (_func_int **)pTVar26;
          return pEVar14;
        }
        uVar24 = 0;
        do {
          uVar24 = (ulong)((int)uVar24 + 1);
          p_Var19 = *(_func_int **)(p_Var19 + 8);
        } while (p_Var19 != (_func_int *)0x0);
        anon_unknown.dwarf_9c70f::Stop
                  (ctx,source,"ERROR: function arguemnt set \'%.*s\' has only %d argument(s)",
                   (ulong)(uint)((int)pp_Var12[3] - (int)pp_Var12[2]),pp_Var12[2],uVar24);
      }
      msg = "ERROR: function argument set is empty";
    }
    goto LAB_0015b96a;
  }
  pTVar16 = value->type;
  pEVar13 = (ExprGetAddress *)value;
  pEVar9 = (ExprGetAddress *)value;
  if (pTVar16 == (TypeBase *)0x0) {
LAB_0015b162:
    if (value->typeID == 0x16) {
      pEVar13 = (ExprGetAddress *)value[1]._vptr_ExprBase;
    }
    else if (value->typeID == 0x22) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pTVar15 = ExpressionContext::GetReferenceType(ctx,value->type);
      iVar6 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      variable = (VariableHandle *)CONCAT44(extraout_var_02,iVar6);
      pVVar11 = (VariableData *)value[1]._vptr_ExprBase;
      variable->source = value->source;
      variable->variable = pVVar11;
      variable->next = (VariableHandle *)0x0;
      variable->listed = false;
      ExprGetAddress::ExprGetAddress
                ((ExprGetAddress *)CONCAT44(extraout_var_01,iVar5),source,&pTVar15->super_TypeBase,
                 variable);
      pEVar13 = (ExprGetAddress *)CONCAT44(extraout_var_01,iVar5);
    }
    else if ((pTVar16 == (TypeBase *)0x0) || (pTVar16->typeID != 0x12)) {
      bVar27 = AssertValueExpression(ctx,source,value);
      if (!bVar27) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        pEVar7 = (ExprBase *)CONCAT44(extraout_var_11,iVar5);
        pTVar16 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
        puVar17 = (undefined8 *)CONCAT44(extraout_var_12,iVar5);
        pTVar18 = ExpressionContext::GetErrorType(ctx);
        *(undefined4 *)(puVar17 + 1) = 0;
        puVar17[2] = source;
        puVar17[3] = pTVar18;
        puVar17[4] = 0;
        *(undefined1 *)(puVar17 + 5) = 0;
        *puVar17 = &PTR__ExprError_00223b38;
        puVar17[0xc] = 0;
        puVar17[6] = puVar17 + 8;
        puVar17[7] = 0x400000000;
        pEVar7->typeID = 0x1b;
        pEVar7->source = source;
        pEVar7->type = pTVar16;
        pEVar7->next = (ExprBase *)0x0;
        pEVar7->listed = false;
        pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223ef0;
        pEVar7[1]._vptr_ExprBase = (_func_int **)value;
        *(undefined8 **)&pEVar7[1].typeID = puVar17;
        return pEVar7;
      }
      pSVar10 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      pVVar11 = anon_unknown.dwarf_9c70f::AllocateTemporary(ctx,pSVar10,value->type);
      pEVar7 = CreateVariableAccess(ctx,pSVar10,pVVar11,false);
      pEVar7 = CreateAssignment(ctx,pSVar10,pEVar7,value);
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pEVar14 = (ExprBase *)CONCAT44(extraout_var_05,iVar5);
      pTVar16 = ctx->typeVoid;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      pp_Var12 = (_func_int **)CONCAT44(extraout_var_06,iVar5);
      *pp_Var12 = (_func_int *)0x0;
      pp_Var12[1] = (_func_int *)pVVar11;
      pp_Var12[2] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var12 + 3) = 0;
      pEVar14->typeID = 0x1e;
      pEVar14->source = pSVar10;
      pEVar14->type = pTVar16;
      pEVar14->next = (ExprBase *)0x0;
      pEVar14->listed = false;
      pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a58;
      pEVar14[1]._vptr_ExprBase = pp_Var12;
      *(ExprBase **)&pEVar14[1].typeID = pEVar7;
      pEVar7 = CreateVariableAccess(ctx,pSVar10,pVVar11,false);
      pEVar7 = CreateGetAddress(ctx,pSVar10,pEVar7);
      pEVar13 = (ExprGetAddress *)CreateSequence(ctx,source,pEVar14,pEVar7);
    }
  }
  else if (pTVar16->typeID != 0x14) {
    if (pTVar16->typeID != 0x12) goto LAB_0015b162;
    iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
    pEVar9 = (ExprGetAddress *)CONCAT44(extraout_var_00,iVar5);
    pTVar16 = (TypeBase *)pTVar16[1]._vptr_TypeBase;
    (pEVar9->super_ExprBase).typeID = 0x16;
    (pEVar9->super_ExprBase).source = source;
    (pEVar9->super_ExprBase).type = pTVar16;
    (pEVar9->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar9->super_ExprBase).listed = false;
    (pEVar9->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
    pEVar9->variable = (VariableHandle *)value;
    if ((pTVar16 != (TypeBase *)0x0) && (pTVar16->typeID == 0x14)) {
      pEVar13 = pEVar9;
    }
  }
  pTVar16 = (pEVar13->super_ExprBase).type;
  if (((pTVar16 == (TypeBase *)0x0) || (pTVar16->typeID != 0x12)) &&
     (pTVar26 = (pEVar9->super_ExprBase).type, pTVar26->typeID != 0x14)) goto LAB_0015b8ab;
  bVar27 = uVar21 != 1;
  typePair.a = pTVar16;
  if (uVar21 == 0) {
    typePair.b = (TypeBase *)0x0;
LAB_0015b2b2:
    pAVar1 = ctx->allocator;
    lVar22 = 0x20;
    do {
      *(undefined8 *)((long)&typePair.a + lVar22) = 0;
      *(undefined1 *)((long)&typePair.b + lVar22) = 0;
      *(undefined8 *)((long)local_108.little + lVar22 + -0x10) = 0;
      *(undefined8 *)((long)local_108.little + lVar22 + -8) = 0;
      *(undefined8 *)((long)&local_108.little[0].source + lVar22) = 0;
      *(undefined8 *)(&local_108.little[0].isExplicit + lVar22) = 0;
      lVar22 = lVar22 + 0x30;
    } while (lVar22 != 0xe0);
    local_108.data = local_108.little;
    local_108.max = 4;
    local_108.little[0].source = (pEVar13->super_ExprBase).source;
    local_108.little[0].type = (pEVar13->super_ExprBase).type;
    local_108.count = 1;
    local_108.little[0].isExplicit = false;
    local_108.little[0].name = (SynIdentifier *)0x0;
    local_108.little[0].valueFunction = (FunctionData *)0x0;
    uVar24 = 1;
    local_108.little[0].value = &pEVar13->super_ExprBase;
    local_108.allocator = pAVar1;
    if (uVar21 != 0) {
      lVar22 = 0;
      do {
        if (local_108.count == local_108.max) {
          SmallArray<ArgumentData,_4U>::grow(&local_108,local_108.count);
        }
        if (local_108.data == (ArgumentData *)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ArgumentData, 4>::push_back(const T &) [T = ArgumentData, N = 4]"
                       );
        }
        puVar17 = (undefined8 *)((long)&pAVar20->source + lVar22);
        uVar24 = (ulong)local_108.count;
        local_108.count = local_108.count + 1;
        pSVar10 = (SynBase *)*puVar17;
        uVar2 = puVar17[1];
        pSVar3 = (SynIdentifier *)puVar17[2];
        pTVar16 = (TypeBase *)puVar17[3];
        pFVar4 = (FunctionData *)puVar17[5];
        local_108.data[uVar24].value = (ExprBase *)puVar17[4];
        (&local_108.data[uVar24].value)[1] = (ExprBase *)pFVar4;
        local_108.data[uVar24].name = pSVar3;
        (&local_108.data[uVar24].name)[1] = (SynIdentifier *)pTVar16;
        local_108.data[uVar24].source = pSVar10;
        *(undefined8 *)&local_108.data[uVar24].isExplicit = uVar2;
        lVar22 = lVar22 + 0x30;
      } while ((ulong)uVar21 * 0x30 != lVar22);
      uVar24 = (ulong)local_108.count;
    }
    name.end = "";
    name.begin = "[]";
    arguments_00._8_8_ = uVar24;
    arguments_00.data = local_108.data;
    pEVar7 = CreateFunctionCallByName(ctx,source,name,arguments_00,true,false,true);
    if (pEVar7 == (ExprBase *)0x0) {
      if (local_108.count == 0) {
        __assert_fail("index < count",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x199,
                      "T &SmallArray<ArgumentData, 4>::operator[](unsigned int) [T = ArgumentData, N = 4]"
                     );
      }
      pTVar16 = (pEVar9->super_ExprBase).type;
      (local_108.data)->source = (pEVar9->super_ExprBase).source;
      (local_108.data)->isExplicit = false;
      (local_108.data)->name = (SynIdentifier *)0x0;
      (local_108.data)->type = pTVar16;
      (local_108.data)->value = &pEVar9->super_ExprBase;
      (local_108.data)->valueFunction = (FunctionData *)0x0;
      arguments_01.count = local_108.count;
      arguments_01.data = local_108.data;
      name_00.end = "";
      name_00.begin = "[]";
      arguments_01._12_4_ = 0;
      pEVar7 = CreateFunctionCallByName
                         (ctx,source,name_00,arguments_01,(bool)(bVar27 ^ 1),false,true);
      if (pEVar7 == (ExprBase *)0x0) {
        SmallDenseSet<TypePair,_TypePairHasher,_32U>::insert
                  (&ctx->noIndexOperatorForTypePair,&typePair);
        SmallArray<ArgumentData,_4U>::~SmallArray(&local_108);
        if (bVar27 != false) {
          msg = "ERROR: overloaded \'[]\' operator is not available";
          goto LAB_0015b96a;
        }
        goto LAB_0015b638;
      }
      pTVar16 = pEVar7->type;
      if ((pTVar16 != (TypeBase *)0x0) && (pTVar16->typeID == 0x12)) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar14 = (ExprBase *)CONCAT44(extraout_var_04,iVar5);
        goto LAB_0015b4ba;
      }
    }
    else {
      pTVar16 = pEVar7->type;
      if ((pTVar16 != (TypeBase *)0x0) && (pTVar16->typeID == 0x12)) {
        iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
        pEVar14 = (ExprBase *)CONCAT44(extraout_var_03,iVar5);
LAB_0015b4ba:
        pTVar16 = (TypeBase *)pTVar16[1]._vptr_TypeBase;
        pEVar14->typeID = 0x16;
        pEVar14->source = source;
        pEVar14->type = pTVar16;
        pEVar14->next = (ExprBase *)0x0;
        pEVar14->listed = false;
        pEVar14->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
        pEVar14[1]._vptr_ExprBase = (_func_int **)pEVar7;
        pEVar7 = pEVar14;
      }
    }
    SmallArray<ArgumentData,_4U>::~SmallArray(&local_108);
  }
  else {
    lVar22 = 0;
    bVar25 = bVar27;
    do {
      bVar25 = (bool)(bVar25 | *(long *)((long)&pAVar20->name + lVar22) != 0);
      lVar22 = lVar22 + 0x30;
    } while ((ulong)uVar21 * 0x30 != lVar22);
    if (uVar21 == 0) {
      typePair.b = (TypeBase *)0x0;
    }
    else {
      typePair.b = pAVar20->type;
    }
    bVar27 = true;
    if (bVar25) goto LAB_0015b2b2;
    bVar27 = SmallDenseSet<TypePair,_TypePairHasher,_32U>::contains
                       (&ctx->noIndexOperatorForTypePair,&typePair);
    if (!bVar27) {
      bVar27 = false;
      goto LAB_0015b2b2;
    }
LAB_0015b638:
    if (uVar21 == 0) {
      __assert_fail("index < count",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                    ,0x22a,"T &ArrayView<ArgumentData>::operator[](unsigned int) [T = ArgumentData]"
                   );
    }
    pEVar7 = CreateCast(ctx,source,pAVar20->value,ctx->typeInt,false);
    pEVar14 = anon_unknown.dwarf_9c70f::EvaluateExpression(ctx,source,pEVar7);
    bVar27 = true;
    if ((pEVar14 == (ExprBase *)0x0) || (pEVar14->typeID != 6)) {
      pEVar14 = (ExprBase *)0x0;
    }
    else {
      if ((long)pEVar14[1]._vptr_ExprBase < 0) {
        msg = "ERROR: array index cannot be negative";
        goto LAB_0015b96a;
      }
      bVar27 = false;
    }
    pTVar26 = (pEVar9->super_ExprBase).type;
    if (pTVar26 == (TypeBase *)0x0) {
LAB_0015b8ab:
      anon_unknown.dwarf_9c70f::Stop
                (ctx,source,"ERROR: type \'%.*s\' is not an array",
                 (ulong)(uint)(*(int *)&(pTVar26->name).end - (int)(pTVar26->name).begin));
    }
    if (pTVar26->typeID == 0x14) {
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pp_Var12 = (_func_int **)CONCAT44(extraout_var_09,iVar5);
      pTVar15 = ExpressionContext::GetReferenceType(ctx,*(TypeBase **)&pTVar26[1].typeIndex);
      *(undefined4 *)(pp_Var12 + 1) = 0x1b;
      pp_Var12[2] = (_func_int *)source;
      pp_Var12[3] = (_func_int *)pTVar15;
      pp_Var12[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var12 + 5) = 0;
      *pp_Var12 = (_func_int *)&PTR__ExprBase_00223ef0;
      pp_Var12[6] = (_func_int *)pEVar13;
      pp_Var12[7] = (_func_int *)pEVar7;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_10,iVar5);
      pTVar16 = *(TypeBase **)&pTVar26[1].typeIndex;
    }
    else {
      if (pTVar26->typeID != 0x13) goto LAB_0015b8ab;
      if ((!bVar27) &&
         (lVar22._0_4_ = pTVar26[1].typeID, lVar22._4_4_ = pTVar26[1].nameHash,
         lVar22 <= (long)pEVar14[1]._vptr_ExprBase)) {
        msg = "ERROR: array index out of bounds";
LAB_0015b96a:
        anon_unknown.dwarf_9c70f::Stop(ctx,source,msg);
      }
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
      pp_Var12 = (_func_int **)CONCAT44(extraout_var_07,iVar5);
      pTVar15 = ExpressionContext::GetReferenceType(ctx,(TypeBase *)pTVar26[1]._vptr_TypeBase);
      *(undefined4 *)(pp_Var12 + 1) = 0x1b;
      pp_Var12[2] = (_func_int *)source;
      pp_Var12[3] = (_func_int *)pTVar15;
      pp_Var12[4] = (_func_int *)0x0;
      *(undefined1 *)(pp_Var12 + 5) = 0;
      *pp_Var12 = (_func_int *)&PTR__ExprBase_00223ef0;
      pp_Var12[6] = (_func_int *)pEVar13;
      pp_Var12[7] = (_func_int *)pEVar7;
      iVar5 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x38);
      pEVar7 = (ExprBase *)CONCAT44(extraout_var_08,iVar5);
      pTVar16 = (TypeBase *)pTVar26[1]._vptr_TypeBase;
    }
    pEVar7->typeID = 0x16;
    pEVar7->source = source;
    pEVar7->type = pTVar16;
    pEVar7->next = (ExprBase *)0x0;
    pEVar7->listed = false;
    pEVar7->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00223a90;
    pEVar7[1]._vptr_ExprBase = pp_Var12;
  }
  return pEVar7;
}

Assistant:

ExprBase* CreateArrayIndex(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<ArgumentData> arguments)
{
	// Handle argument[x] expresion
	if(ExprTypeLiteral *type = getType<ExprTypeLiteral>(value))
	{
		if(TypeArgumentSet *argumentSet = getType<TypeArgumentSet>(type->value))
		{
			if(arguments.size() == 1)
			{
				if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, arguments[0].value)))
				{
					if(number->value < 0)
						Stop(ctx, source, "ERROR: argument index can't be negative");

					if(argumentSet->types.empty())
						Stop(ctx, source, "ERROR: function argument set is empty");

					if(number->value >= argumentSet->types.size())
						Stop(ctx, source, "ERROR: function arguemnt set '%.*s' has only %d argument(s)", FMT_ISTR(argumentSet->name), argumentSet->types.size());

					return new (ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(source, ctx.typeTypeID, argumentSet->types[unsigned(number->value)]->type);
				}
				else
				{
					Stop(ctx, source, "ERROR: expression didn't evaluate to a constant number");
				}
			}
		}
	}

	ExprBase* wrapped = value;

	if(TypeRef *refType = getType<TypeRef>(value->type))
	{
		value = new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, value);

		if(isType<TypeUnsizedArray>(value->type))
			wrapped = value;
	}
	else if(isType<TypeUnsizedArray>(value->type))
	{
		wrapped = value; // Do not modify
	}
	else if(ExprVariableAccess *node = getType<ExprVariableAccess>(value))
	{
		wrapped = new (ctx.get<ExprGetAddress>()) ExprGetAddress(source, ctx.GetReferenceType(value->type), new (ctx.get<VariableHandle>()) VariableHandle(node->source, node->variable));
	}
	else if(ExprDereference *node = getType<ExprDereference>(value))
	{
		wrapped = node->value;
	}
	else if(!isType<TypeRef>(wrapped->type))
	{
		if(!AssertValueExpression(ctx, source, wrapped))
			return new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetErrorType(), value, new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType()));

		SynBase *sourceInternal = ctx.MakeInternal(source);

		VariableData *storage = AllocateTemporary(ctx, sourceInternal, wrapped->type);

		ExprBase *assignment = CreateAssignment(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false), value);

		ExprBase *definition = new (ctx.get<ExprVariableDefinition>()) ExprVariableDefinition(sourceInternal, ctx.typeVoid, new (ctx.get<VariableHandle>()) VariableHandle(NULL, storage), assignment);

		wrapped = CreateSequence(ctx, source, definition, CreateGetAddress(ctx, sourceInternal, CreateVariableAccess(ctx, sourceInternal, storage, false)));
	}

	if(isType<TypeRef>(wrapped->type) || isType<TypeUnsizedArray>(value->type))
	{
		bool findOverload = arguments.empty() || arguments.size() > 1;

		for(unsigned i = 0; i < arguments.size(); i++)
		{
			if(arguments[i].name)
				findOverload = true;
		}

		TypePair typePair(wrapped->type, arguments.empty() ? NULL : arguments[0].type);

		if(findOverload || !ctx.noIndexOperatorForTypePair.contains(typePair))
		{
			SmallArray<ArgumentData, 4> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(wrapped->source, false, NULL, wrapped->type, wrapped));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, true, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			callArguments[0] = ArgumentData(value->source, false, NULL, value->type, value);

			if(ExprBase *result = CreateFunctionCallByName(ctx, source, InplaceStr("[]"), callArguments, !findOverload, false, true))
			{
				if(TypeRef *refType = getType<TypeRef>(result->type))
					return new (ctx.get<ExprDereference>()) ExprDereference(source, refType->subType, result);

				return result;
			}

			ctx.noIndexOperatorForTypePair.insert(typePair);
		}

		if(findOverload)
			Stop(ctx, source, "ERROR: overloaded '[]' operator is not available");

		ExprBase *index = CreateCast(ctx, source, arguments[0].value, ctx.typeInt, false);

		ExprIntegerLiteral *indexValue = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, source, index));

		if(indexValue && indexValue->value < 0)
			Stop(ctx, source, "ERROR: array index cannot be negative");

		if(TypeArray *type = getType<TypeArray>(value->type))
		{
			if(indexValue && indexValue->value >= type->length)
				Stop(ctx, source, "ERROR: array index out of bounds");

			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}

		if(TypeUnsizedArray *type = getType<TypeUnsizedArray>(value->type))
		{
			// Array index only shifts an address, so we are left with a reference to get value from
			ExprArrayIndex *shift = new (ctx.get<ExprArrayIndex>()) ExprArrayIndex(source, ctx.GetReferenceType(type->subType), wrapped, index);

			return new (ctx.get<ExprDereference>()) ExprDereference(source, type->subType, shift);
		}
	}

	Stop(ctx, source, "ERROR: type '%.*s' is not an array", FMT_ISTR(value->type->name));

	return NULL;
}